

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

JSONNode __thiscall JSONNode::duplicate(JSONNode *this)

{
  ulong uVar1;
  size_t sVar2;
  internalJSONNode *orig;
  undefined8 *in_RSI;
  
  orig = (internalJSONNode *)*in_RSI;
  sVar2 = orig->refcount;
  uVar1 = sVar2 + 1;
  orig->refcount = uVar1;
  this->internal = orig;
  if (1 < uVar1) {
    orig->refcount = sVar2;
    orig = internalJSONNode::newInternal(orig);
  }
  this->internal = orig;
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::duplicate(void) const json_nothrow {
    JSON_CHECK_INTERNAL();
    JSONNode mycopy(*this);
    #ifdef JSON_REF_COUNT
	   JSON_ASSERT(internal == mycopy.internal, JSON_TEXT("copy ctor failed to ref count correctly"));
	   mycopy.makeUniqueInternal();
    #endif
    JSON_ASSERT(internal != mycopy.internal, JSON_TEXT("makeUniqueInternal failed"));
    return mycopy;
}